

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_hq.c
# Opt level: O2

void BrotliZopfliCreateCommands
               (size_t num_bytes,size_t block_start,size_t max_backward_limit,ZopfliNode *nodes,
               int *dist_cache,size_t *last_insert_len,BrotliEncoderParams *params,
               Command_conflict *commands,size_t *num_literals)

{
  uint32_t uVar1;
  uint uVar2;
  uint uVar3;
  ushort uVar4;
  ulong uVar5;
  byte bVar6;
  uint uVar7;
  ulong uVar8;
  uint32_t uVar9;
  ulong uVar10;
  long lVar11;
  ushort uVar12;
  ulong uVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  ulong uVar19;
  ushort uVar20;
  long lVar21;
  uint16_t *puVar22;
  bool bVar23;
  
  puVar22 = &commands->dist_prefix_;
  lVar11 = 0;
  lVar21 = 0;
  uVar9 = (nodes->u).next;
  while (uVar9 != 0xffffffff) {
    uVar17 = nodes[lVar21 + (ulong)uVar9].length;
    uVar18 = nodes[lVar21 + (ulong)uVar9].dcode_insert_length;
    uVar10 = (ulong)(uVar18 & 0x7ffffff);
    uVar1 = nodes[lVar21 + (ulong)uVar9].u.next;
    bVar23 = lVar11 == 0;
    lVar11 = lVar11 + -1;
    uVar8 = uVar10;
    if (bVar23) {
      uVar8 = *last_insert_len + uVar10;
      *last_insert_len = 0;
    }
    uVar7 = uVar17 & 0x1ffffff;
    uVar2 = nodes[lVar21 + (ulong)uVar9].distance;
    iVar15 = uVar7 - (uVar17 >> 0x19);
    uVar16 = iVar15 + 9;
    uVar5 = block_start + lVar21 + uVar10;
    if (max_backward_limit <= uVar5) {
      uVar5 = max_backward_limit;
    }
    uVar3 = (uVar18 >> 0x1b) - 1;
    if (uVar18 < 0x8000000) {
      uVar3 = uVar2 + 0xf;
    }
    ((Command_conflict *)(puVar22 + -7))->insert_len_ = (uint32_t)uVar8;
    *(uint *)(puVar22 + -5) = (uVar16 - uVar17) * 0x2000000 | uVar7;
    uVar19 = (ulong)(params->dist).num_direct_distance_codes;
    uVar13 = uVar19 + 0x10;
    if (uVar3 < uVar13) {
      uVar9 = 0;
      uVar12 = (ushort)uVar3;
    }
    else {
      uVar9 = (params->dist).distance_postfix_bits;
      bVar6 = (byte)uVar9;
      uVar19 = ((uVar3 - uVar19) + (4L << (bVar6 & 0x3f))) - 0x10;
      uVar17 = 0x1f;
      if ((uint)uVar19 != 0) {
        for (; (uint)uVar19 >> uVar17 == 0; uVar17 = uVar17 - 1) {
        }
      }
      uVar17 = (uVar17 ^ 0xffffffe0) + 0x1f;
      bVar23 = (uVar19 >> ((ulong)uVar17 & 0x3f) & 1) != 0;
      iVar14 = uVar17 - uVar9;
      uVar12 = (short)((uint)bVar23 + iVar14 * 2 + 0xfffe << (bVar6 & 0x3f)) +
               (short)uVar13 + (~(ushort)(-1 << (bVar6 & 0x1f)) & (ushort)uVar19) |
               (short)iVar14 * 0x400;
      uVar9 = (uint32_t)(uVar19 - ((ulong)bVar23 + 2 << ((byte)uVar17 & 0x3f)) >> (bVar6 & 0x3f));
    }
    *puVar22 = uVar12;
    *(uint32_t *)(puVar22 + -3) = uVar9;
    if (uVar8 < 6) {
      uVar13 = uVar8 & 0xffffffff;
    }
    else if (uVar8 < 0x82) {
      uVar17 = 0x1f;
      uVar18 = (uint)(uVar8 - 2);
      if (uVar18 != 0) {
        for (; uVar18 >> uVar17 == 0; uVar17 = uVar17 - 1) {
        }
      }
      uVar13 = (ulong)((int)(uVar8 - 2 >> ((char)(uVar17 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                       (uVar17 ^ 0xffffffe0) * 2 + 0x40);
    }
    else if (uVar8 < 0x842) {
      uVar18 = (uint32_t)uVar8 - 0x42;
      uVar17 = 0x1f;
      if (uVar18 != 0) {
        for (; uVar18 >> uVar17 == 0; uVar17 = uVar17 - 1) {
        }
      }
      uVar13 = (ulong)((uVar17 ^ 0xffe0) + 0x2a);
    }
    else {
      uVar13 = 0x15;
      if (0x1841 < uVar8) {
        uVar13 = (ulong)(ushort)(0x17 - (uVar8 < 0x5842));
      }
    }
    if (uVar16 < 10) {
      uVar17 = iVar15 + 7;
    }
    else if (uVar16 < 0x86) {
      uVar18 = iVar15 + 3;
      uVar17 = 0x1f;
      if (uVar18 != 0) {
        for (; uVar18 >> uVar17 == 0; uVar17 = uVar17 - 1) {
        }
      }
      uVar17 = (int)((ulong)(long)(int)uVar18 >> ((char)(uVar17 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
               (uVar17 ^ 0xffffffe0) * 2 + 0x42;
    }
    else {
      uVar17 = 0x17;
      if (uVar16 < 0x846) {
        uVar17 = 0x1f;
        if (iVar15 - 0x3dU != 0) {
          for (; iVar15 - 0x3dU >> uVar17 == 0; uVar17 = uVar17 - 1) {
          }
        }
        uVar17 = (uVar17 ^ 0xffe0) + 0x2c;
      }
    }
    uVar4 = (ushort)uVar17;
    uVar20 = (uVar4 & 7) + ((ushort)uVar13 & 7) * 8;
    if ((((uVar12 & 0x3ff) == 0) && ((ushort)uVar13 < 8)) && (uVar4 < 0x10)) {
      if (7 < uVar4) {
        uVar20 = uVar20 + 0x40;
      }
    }
    else {
      iVar15 = (int)((uVar13 & 0xffff) >> 3) * 3 + ((uVar17 & 0xffff) >> 3);
      uVar20 = uVar20 + ((ushort)(0x520d40 >> ((char)iVar15 * '\x02' & 0x1fU)) & 0xc0) +
                        (short)iVar15 * 0x40 + 0x40;
    }
    puVar22[-1] = uVar20;
    if ((uVar2 <= uVar5) && (uVar3 != 0)) {
      dist_cache[3] = dist_cache[2];
      *(undefined8 *)(dist_cache + 1) = *(undefined8 *)dist_cache;
      *dist_cache = uVar2;
    }
    *num_literals = *num_literals + uVar8;
    lVar21 = lVar21 + uVar10 + (ulong)uVar7;
    puVar22 = puVar22 + 8;
    uVar9 = uVar1;
  }
  *last_insert_len = *last_insert_len + (num_bytes - lVar21);
  return;
}

Assistant:

void BrotliZopfliCreateCommands(const size_t num_bytes,
                                const size_t block_start,
                                const size_t max_backward_limit,
                                const ZopfliNode* nodes,
                                int* dist_cache,
                                size_t* last_insert_len,
                                const BrotliEncoderParams* params,
                                Command* commands,
                                size_t* num_literals) {
  size_t pos = 0;
  uint32_t offset = nodes[0].u.next;
  size_t i;
  size_t gap = 0;
  for (i = 0; offset != BROTLI_UINT32_MAX; i++) {
    const ZopfliNode* next = &nodes[pos + offset];
    size_t copy_length = ZopfliNodeCopyLength(next);
    size_t insert_length = next->dcode_insert_length & 0x7FFFFFF;
    pos += insert_length;
    offset = next->u.next;
    if (i == 0) {
      insert_length += *last_insert_len;
      *last_insert_len = 0;
    }
    {
      size_t distance = ZopfliNodeCopyDistance(next);
      size_t len_code = ZopfliNodeLengthCode(next);
      size_t max_distance =
          BROTLI_MIN(size_t, block_start + pos, max_backward_limit);
      BROTLI_BOOL is_dictionary = TO_BROTLI_BOOL(distance > max_distance + gap);
      size_t dist_code = ZopfliNodeDistanceCode(next);
      InitCommand(&commands[i], &params->dist, insert_length,
          copy_length, (int)len_code - (int)copy_length, dist_code);

      if (!is_dictionary && dist_code > 0) {
        dist_cache[3] = dist_cache[2];
        dist_cache[2] = dist_cache[1];
        dist_cache[1] = dist_cache[0];
        dist_cache[0] = (int)distance;
      }
    }

    *num_literals += insert_length;
    pos += copy_length;
  }
  *last_insert_len += num_bytes - pos;
}